

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.h
# Opt level: O1

void __thiscall
nlohmann::detail::input_stream_adapter::input_stream_adapter(input_stream_adapter *this,istream *i)

{
  streambuf *psVar1;
  byte *pbVar2;
  int iVar3;
  uint uVar4;
  
  (this->super_input_adapter_protocol)._vptr_input_adapter_protocol =
       (_func_int **)&PTR_get_character_001c8460;
  this->is = i;
  psVar1 = *(streambuf **)(i + *(long *)(*(long *)i + -0x18) + 0xe8);
  this->sb = psVar1;
  pbVar2 = *(byte **)(psVar1 + 0x10);
  if (pbVar2 < *(byte **)(psVar1 + 0x18)) {
    uVar4 = (uint)*pbVar2;
    *(byte **)(psVar1 + 0x10) = pbVar2 + 1;
  }
  else {
    uVar4 = (**(code **)(*(long *)psVar1 + 0x50))();
  }
  if (uVar4 == 0xffffffff) {
    return;
  }
  if (uVar4 != 0xef) {
    std::istream::unget();
    return;
  }
  iVar3 = (**(this->super_input_adapter_protocol)._vptr_input_adapter_protocol)(this);
  if (iVar3 != -1) {
    if (iVar3 == 0xbb) {
      iVar3 = (**(this->super_input_adapter_protocol)._vptr_input_adapter_protocol)(this);
      if (iVar3 != -1) {
        if (iVar3 == 0xbf) {
          return;
        }
        std::istream::unget();
      }
      std::istream::putback((char)this->is);
    }
    else {
      std::istream::unget();
    }
  }
  std::istream::putback((char)this->is);
  return;
}

Assistant:

explicit input_stream_adapter(std::istream& i)
: is(i), sb(*i.rdbuf())
{
// skip byte order mark
std::char_traits<char>::int_type c;
if ((c = get_character()) == 0xEF)
{
if ((c = get_character()) == 0xBB)
{
if ((c = get_character()) == 0xBF)
{
return; // Ignore BOM
}
else if (c != std::char_traits<char>::eof())
{
is.unget();
}
is.putback('\xBB');
}
else if (c != std::char_traits<char>::eof())
{
is.unget();
}
is.putback('\xEF');
}
else if (c != std::char_traits<char>::eof())
{
is.unget(); // no byte order mark; process as usual
}
}